

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::(anonymous_namespace)::
sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (_anonymous_namespace_ *this,xpath_node *begin,xpath_node *end,
          document_order_comparator *pred)

{
  int *piVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 *puVar4;
  xml_attribute_struct *pxVar5;
  xml_node_struct *pxVar6;
  xml_attribute_struct *pxVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  long lVar11;
  uint uVar12;
  xpath_node *extraout_RDX;
  xpath_node *extraout_RDX_00;
  xpath_node *pxVar14;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *pxVar15;
  xpath_node *pxVar16;
  xpath_node *lhs;
  long lVar17;
  ulong uVar18;
  xpath_node *this_00;
  ulong uVar19;
  xpath_node *this_01;
  xpath_node *pxVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  xpath_node val;
  xpath_node *pxVar13;
  
LAB_0011d90e:
  pxVar15 = begin + -1;
  do {
    uVar19 = (long)begin - (long)this >> 4;
    if ((long)uVar19 < 0x21) {
      if ((xpath_node *)this != begin) {
        lVar17 = 0x10;
        pxVar16 = (xpath_node *)this;
        while (pxVar13 = pxVar16 + 1, pxVar13 != begin) {
          val._node._root = (pxVar13->_node)._root;
          val._attribute._attr = pxVar16[1]._attribute._attr;
          bVar9 = anon_unknown_0::document_order_comparator::operator()
                            ((document_order_comparator *)&val,(xpath_node *)this,pxVar15);
          lVar11 = lVar17;
          pxVar15 = extraout_RDX_02;
          pxVar16 = pxVar13;
          if (bVar9) {
            for (; pxVar16 = (xpath_node *)this, lVar11 != 0; lVar11 = lVar11 + -0x10) {
              puVar4 = (undefined8 *)
                       ((long)&(((xpath_node *)((long)this + -0x10))->_node)._root + lVar11);
              uVar8 = puVar4[1];
              puVar2 = (undefined8 *)((long)&(((xpath_node *)this)->_node)._root + lVar11);
              *puVar2 = *puVar4;
              puVar2[1] = uVar8;
            }
          }
          else {
            while( true ) {
              pxVar14 = pxVar16 + -1;
              bVar9 = anon_unknown_0::document_order_comparator::operator()
                                ((document_order_comparator *)&val,pxVar14,pxVar15);
              pxVar15 = extraout_RDX_03;
              if (!bVar9) break;
              pxVar5 = pxVar16[-1]._attribute._attr;
              (pxVar16->_node)._root = (pxVar14->_node)._root;
              (pxVar16->_attribute)._attr = pxVar5;
              pxVar16 = pxVar14;
            }
          }
          (pxVar16->_node)._root = val._node._root;
          (pxVar16->_attribute)._attr = val._attribute._attr;
          lVar17 = lVar17 + 0x10;
          pxVar16 = pxVar13;
        }
      }
      return;
    }
    uVar19 = uVar19 >> 1;
    pxVar16 = (xpath_node *)((long)this + uVar19 * 0x10);
    lVar17 = (long)pxVar15 - (long)this >> 4;
    pxVar13 = pxVar15;
    pxVar14 = (xpath_node *)this;
    if (0x28 < lVar17) {
      uVar18 = lVar17 + 1U >> 3;
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                ((xpath_node *)this,(xpath_node *)((long)this + uVar18 * 0x10),
                 (xpath_node *)((long)this + uVar18 * 2 * 0x10),pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar16 + -uVar18,pxVar16,pxVar16 + uVar18,pred);
      median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                (pxVar15 + uVar18 * -2,pxVar15 + -uVar18,pxVar15,pred);
      pxVar13 = pxVar15 + -uVar18;
      pxVar14 = (xpath_node *)((long)this + uVar18 * 0x10);
    }
    median3<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (pxVar14,pxVar16,pxVar13,pred);
    lVar17 = uVar19 * 0x10;
    do {
      lVar11 = lVar17;
      if (lVar11 == 0) break;
      piVar3 = (int *)((long)&(((xpath_node *)((long)this + -0x10))->_node)._root + lVar11);
      piVar1 = (int *)((long)&(((xpath_node *)this)->_node)._root + lVar11);
      auVar25._0_4_ = -(uint)(*piVar1 == *piVar3);
      auVar25._4_4_ = -(uint)(piVar1[1] == piVar3[1]);
      auVar25._8_4_ = -(uint)(piVar1[2] == piVar3[2]);
      auVar25._12_4_ = -(uint)(piVar1[3] == piVar3[3]);
      auVar21._4_4_ = auVar25._0_4_;
      auVar21._0_4_ = auVar25._4_4_;
      auVar21._8_4_ = auVar25._12_4_;
      auVar21._12_4_ = auVar25._8_4_;
      uVar12 = movmskpd((int)pred,auVar21 & auVar25);
      pred = (document_order_comparator *)(ulong)uVar12;
      lVar17 = lVar11 + -0x10;
    } while (uVar12 == 3);
    pxVar16 = (xpath_node *)((long)&(((xpath_node *)this)->_node)._root + lVar11);
    pxVar13 = (xpath_node *)((long)this + uVar19 * 0x10);
    do {
      lhs = pxVar13 + 1;
      pxVar14 = extraout_RDX;
      this_00 = lhs;
      this_01 = pxVar16;
      if (lhs == begin) break;
      auVar26._0_4_ = -(uint)(*(int *)&(pxVar16->_node)._root == *(int *)&(lhs->_node)._root);
      auVar26._4_4_ =
           -(uint)(*(int *)((long)&(pxVar16->_node)._root + 4) ==
                  *(int *)((long)&pxVar13[1]._node._root + 4));
      auVar26._8_4_ =
           -(uint)(*(int *)&(pxVar16->_attribute)._attr == *(int *)&pxVar13[1]._attribute._attr);
      auVar26._12_4_ =
           -(uint)(*(int *)((long)&(pxVar16->_attribute)._attr + 4) ==
                  *(int *)((long)&pxVar13[1]._attribute._attr + 4));
      auVar22._4_4_ = auVar26._0_4_;
      auVar22._0_4_ = auVar26._4_4_;
      auVar22._8_4_ = auVar26._12_4_;
      auVar22._12_4_ = auVar26._8_4_;
      uVar12 = movmskpd((int)pred,auVar22 & auVar26);
      pred = (document_order_comparator *)(ulong)uVar12;
      pxVar13 = lhs;
    } while (uVar12 == 3);
LAB_0011da2b:
    pxVar13 = pxVar16;
    if (lhs != begin) {
      bVar9 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar16,lhs,pxVar14);
      pxVar14 = extraout_RDX_00;
      if (!bVar9) {
        auVar27._0_4_ = -(uint)(*(int *)&(pxVar16->_node)._root == *(int *)&(lhs->_node)._root);
        auVar27._4_4_ =
             -(uint)(*(int *)((long)&(pxVar16->_node)._root + 4) ==
                    *(int *)((long)&(lhs->_node)._root + 4));
        auVar27._8_4_ =
             -(uint)(*(int *)&(pxVar16->_attribute)._attr == *(int *)&(lhs->_attribute)._attr);
        auVar27._12_4_ =
             -(uint)(*(int *)((long)&(pxVar16->_attribute)._attr + 4) ==
                    *(int *)((long)&(lhs->_attribute)._attr + 4));
        auVar23._4_4_ = auVar27._0_4_;
        auVar23._0_4_ = auVar27._4_4_;
        auVar23._8_4_ = auVar27._12_4_;
        auVar23._12_4_ = auVar27._8_4_;
        iVar10 = movmskpd((int)CONCAT71(extraout_var,bVar9),auVar23 & auVar27);
        if (iVar10 != 3) goto LAB_0011da89;
        val._node._root = (lhs->_node)._root;
        val._attribute._attr = (lhs->_attribute)._attr;
        pxVar5 = (this_00->_attribute)._attr;
        (lhs->_node)._root = (this_00->_node)._root;
        (lhs->_attribute)._attr = pxVar5;
        (this_00->_node)._root = val._node._root;
        (this_00->_attribute)._attr = val._attribute._attr;
        this_00 = this_00 + 1;
      }
      lhs = lhs + 1;
      goto LAB_0011da2b;
    }
LAB_0011da89:
    while (pxVar20 = this_01, pxVar20 != (xpath_node *)this) {
      this_01 = pxVar20 + -1;
      bVar9 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)this_01,pxVar13,pxVar14);
      pxVar14 = extraout_RDX_01;
      if (!bVar9) {
        auVar28._0_4_ = -(uint)(*(int *)&(this_01->_node)._root == *(int *)&(pxVar13->_node)._root);
        auVar28._4_4_ =
             -(uint)(*(int *)((long)&pxVar20[-1]._node._root + 4) ==
                    *(int *)((long)&(pxVar13->_node)._root + 4));
        auVar28._8_4_ =
             -(uint)(*(int *)&pxVar20[-1]._attribute._attr == *(int *)&(pxVar13->_attribute)._attr);
        auVar28._12_4_ =
             -(uint)(*(int *)((long)&pxVar20[-1]._attribute._attr + 4) ==
                    *(int *)((long)&(pxVar13->_attribute)._attr + 4));
        auVar24._4_4_ = auVar28._0_4_;
        auVar24._0_4_ = auVar28._4_4_;
        auVar24._8_4_ = auVar28._12_4_;
        auVar24._12_4_ = auVar28._8_4_;
        iVar10 = movmskpd((int)CONCAT71(extraout_var_00,bVar9),auVar24 & auVar28);
        if (iVar10 != 3) {
          if (lhs == begin) {
            pxVar16 = pxVar13 + -1;
            if (pxVar20 != pxVar13) {
              pxVar6 = (this_01->_node)._root;
              pxVar5 = pxVar20[-1]._attribute._attr;
              pxVar7 = pxVar13[-1]._attribute._attr;
              (this_01->_node)._root = (pxVar16->_node)._root;
              pxVar20[-1]._attribute._attr = pxVar7;
              (pxVar16->_node)._root = pxVar6;
              pxVar13[-1]._attribute._attr = pxVar5;
            }
            val._node._root = (pxVar16->_node)._root;
            val._attribute._attr = pxVar13[-1]._attribute._attr;
            pxVar5 = this_00[-1]._attribute._attr;
            (pxVar16->_node)._root = this_00[-1]._node._root;
            pxVar13[-1]._attribute._attr = pxVar5;
            this_00[-1]._node._root = val._node._root;
            this_00[-1]._attribute._attr = val._attribute._attr;
            this_00 = this_00 + -1;
          }
          else {
            val._node._root = (lhs->_node)._root;
            val._attribute._attr = (lhs->_attribute)._attr;
            pxVar5 = pxVar20[-1]._attribute._attr;
            (lhs->_node)._root = (this_01->_node)._root;
            (lhs->_attribute)._attr = pxVar5;
            lhs = lhs + 1;
            (this_01->_node)._root = val._node._root;
            pxVar20[-1]._attribute._attr = val._attribute._attr;
            pxVar16 = pxVar13;
          }
          goto LAB_0011da2b;
        }
        val._node._root = (this_01->_node)._root;
        val._attribute._attr = pxVar20[-1]._attribute._attr;
        pxVar5 = pxVar13[-1]._attribute._attr;
        (this_01->_node)._root = pxVar13[-1]._node._root;
        pxVar20[-1]._attribute._attr = pxVar5;
        pxVar13[-1]._node._root = val._node._root;
        pxVar13[-1]._attribute._attr = val._attribute._attr;
        pxVar13 = pxVar13 + -1;
      }
    }
    if (lhs != begin) {
      if (lhs != this_00) {
        pxVar6 = (pxVar13->_node)._root;
        pxVar5 = (pxVar13->_attribute)._attr;
        pxVar7 = (this_00->_attribute)._attr;
        (pxVar13->_node)._root = (this_00->_node)._root;
        (pxVar13->_attribute)._attr = pxVar7;
        (this_00->_node)._root = pxVar6;
        (this_00->_attribute)._attr = pxVar5;
      }
      val._node._root = (lhs->_node)._root;
      val._attribute._attr = (lhs->_attribute)._attr;
      pxVar5 = (pxVar13->_attribute)._attr;
      (lhs->_node)._root = (pxVar13->_node)._root;
      (lhs->_attribute)._attr = pxVar5;
      lhs = lhs + 1;
      pxVar16 = pxVar13 + 1;
      (pxVar13->_node)._root = val._node._root;
      (pxVar13->_attribute)._attr = val._attribute._attr;
      this_00 = this_00 + 1;
      this_01 = pxVar20;
      goto LAB_0011da2b;
    }
    pred = (document_order_comparator *)((long)begin - (long)this_00);
    if ((long)pred < (long)pxVar13 - (long)this) break;
    sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (this,pxVar13,pxVar14,pred);
    this = (_anonymous_namespace_ *)this_00;
  } while( true );
  sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
            ((_anonymous_namespace_ *)this_00,begin,pxVar14,pred);
  begin = pxVar13;
  goto LAB_0011d90e;
}

Assistant:

void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 32)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			median(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition(begin, middle, end, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		if (begin != end) insertion_sort(begin, end, pred, &*begin);
	}